

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

uint64_t helper_fjcvtzs_arm(float64 value,void *vstatus)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  ulong uVar5;
  byte bVar6;
  int shift;
  int true_exp;
  uint32_t inexact;
  uint64_t frac;
  uint32_t sign;
  uint32_t exp;
  float_status *status;
  void *vstatus_local;
  float64 value_local;
  
  shift = 1;
  uVar4 = extract64(value,0x3f,1);
  iVar1 = (int)uVar4;
  uVar4 = extract64(value,0x34,0xb);
  iVar2 = (int)uVar4;
  uVar4 = extract64(value,0,0x34);
  if (iVar2 == 0) {
    shift = iVar1;
    if (uVar4 != 0) {
      if (*(char *)((long)vstatus + 5) == '\0') {
        float_raise_arm(' ',(float_status *)vstatus);
        shift = 1;
      }
      else {
        float_raise_arm('@',(float_status *)vstatus);
      }
    }
    _true_exp = 0;
    goto LAB_00679148;
  }
  if (iVar2 == 0x7ff) {
    float_raise_arm('\x01',(float_status *)vstatus);
    _true_exp = 0;
    goto LAB_00679148;
  }
  iVar3 = iVar2 + -0x433;
  uVar5 = uVar4 | 0x10000000000000;
  bVar6 = (byte)iVar3;
  if (iVar3 < 0) {
    if (iVar3 < -0x3f) {
      _true_exp = 0;
    }
    else {
      shift = (int)(uVar5 << (bVar6 + 0x40 & 0x3f) != 0);
      _true_exp = uVar5 >> (-bVar6 & 0x3f);
    }
  }
  else if (iVar3 < 0x40) {
    _true_exp = uVar5 << (bVar6 & 0x3f);
  }
  else {
    _true_exp = 0;
  }
  if (iVar2 + -0x3ff < 0x20) {
    uVar5 = 0x7fffffff;
    if (iVar1 != 0) {
      uVar5 = 0x80000000;
    }
    if (uVar5 < _true_exp) goto LAB_00679107;
    if (shift != 0) {
      float_raise_arm(' ',(float_status *)vstatus);
    }
  }
  else {
LAB_00679107:
    float_raise_arm('\x01',(float_status *)vstatus);
    shift = 1;
  }
  if (iVar1 != 0) {
    _true_exp = -_true_exp;
  }
LAB_00679148:
  uVar4 = deposit64(_true_exp,0x20,0x20,(ulong)(uint)shift);
  return uVar4;
}

Assistant:

uint64_t HELPER(fjcvtzs)(float64 value, void *vstatus)
{
    float_status *status = vstatus;
    uint32_t exp, sign;
    uint64_t frac;
    uint32_t inexact = 1; /* !Z */

    sign = extract64(value, 63, 1);
    exp = extract64(value, 52, 11);
    frac = extract64(value, 0, 52);

    if (exp == 0) {
        /* While not inexact for IEEE FP, -0.0 is inexact for JavaScript.  */
        inexact = sign;
        if (frac != 0) {
            if (status->flush_inputs_to_zero) {
                float_raise(float_flag_input_denormal, status);
            } else {
                float_raise(float_flag_inexact, status);
                inexact = 1;
            }
        }
        frac = 0;
    } else if (exp == 0x7ff) {
        /* This operation raises Invalid for both NaN and overflow (Inf).  */
        float_raise(float_flag_invalid, status);
        frac = 0;
    } else {
        int true_exp = exp - 1023;
        int shift = true_exp - 52;

        /* Restore implicit bit.  */
        frac |= 1ull << 52;

        /* Shift the fraction into place.  */
        if (shift >= 0) {
            /* The number is so large we must shift the fraction left.  */
            if (shift >= 64) {
                /* The fraction is shifted out entirely.  */
                frac = 0;
            } else {
                frac <<= shift;
            }
        } else if (shift > -64) {
            /* Normal case -- shift right and notice if bits shift out.  */
            inexact = (frac << (64 + shift)) != 0;
            frac >>= -shift;
        } else {
            /* The fraction is shifted out entirely.  */
            frac = 0;
        }

        /* Notice overflow or inexact exceptions.  */
        if (true_exp > 31 || frac > (sign ? 0x80000000ull : 0x7fffffff)) {
            /* Overflow, for which this operation raises invalid.  */
            float_raise(float_flag_invalid, status);
            inexact = 1;
        } else if (inexact) {
            float_raise(float_flag_inexact, status);
        }

        /* Honor the sign.  */
        if (sign) {
#ifdef _MSC_VER
            frac = 0 - frac;
#else
            frac = -frac;
#endif
        }
    }

    /* Pack the result and the env->ZF representation of Z together.  */
    return deposit64(frac, 32, 32, inexact);
}